

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O0

void __thiscall libDAI::TRW::TRW(TRW *this,FactorGraph *fg,Properties *opts)

{
  unsigned_long uVar1;
  byte bVar2;
  undefined8 uVar3;
  TProb<double> *this_00;
  size_t n;
  edge_type *peVar4;
  long *plVar5;
  Var *this_01;
  long *in_RDI;
  size_t i;
  size_t iI;
  value_type *in_stack_fffffffffffffea8;
  FactorGraph *in_stack_fffffffffffffeb0;
  Properties *in_stack_fffffffffffffec0;
  FactorGraph *in_stack_fffffffffffffec8;
  DAIAlg<libDAI::FactorGraph> *in_stack_fffffffffffffed0;
  allocator<char> *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  TProb<double> *pTVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  string *msg;
  undefined1 auVar7 [16];
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *__x;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *this_02;
  TProb<double> *local_58;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  
  DAIAlg<libDAI::FactorGraph>::DAIAlg
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  *in_RDI = (long)&PTR_clone_00d4e770;
  in_RDI[0x26] = 0;
  in_RDI[0x27] = 0;
  in_RDI[0x28] = 0;
  in_RDI[0x29] = 0;
  in_RDI[0x23] = 0;
  in_RDI[0x24] = 0;
  in_RDI[0x25] = 0;
  in_RDI[0x26] = 0;
  {unnamed_type#1}::TRW((anon_struct_56_7_6afb2449_for_Props *)0xba1950);
  in_RDI[0x2a] = 0;
  in_RDI[0x2b] = 0;
  msg = (string *)(in_RDI + 0x2c);
  auVar7 = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(in_RDI + 0x2c) = (undefined1  [16])0x0;
  in_RDI[0x2e] = 0;
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::vector
            ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)0xba19a4);
  in_RDI[0x2f] = auVar7._0_8_;
  in_RDI[0x30] = auVar7._8_8_;
  in_RDI[0x31] = 0;
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::vector
            ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)0xba19df);
  __x = (vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)0x0;
  this_02 = (vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)0x0;
  in_RDI[0x34] = 0;
  in_RDI[0x35] = 0;
  in_RDI[0x36] = 0;
  in_RDI[0x37] = 0;
  in_RDI[0x32] = 0;
  in_RDI[0x33] = 0;
  in_RDI[0x34] = 0;
  in_RDI[0x35] = 0;
  WeightedGraph<double>::WeightedGraph((WeightedGraph<double> *)0xba1a1e);
  in_RDI[0x3a] = (long)__x;
  in_RDI[0x3b] = (long)this_02;
  in_RDI[0x3c] = 0;
  in_RDI[0x3d] = 0;
  in_RDI[0x38] = (long)__x;
  in_RDI[0x39] = (long)this_02;
  in_RDI[0x3a] = 0;
  in_RDI[0x3b] = 0;
  WeightedGraph<double>::WeightedGraph((WeightedGraph<double> *)0xba1a59);
  bVar2 = (**(code **)(*in_RDI + 0x88))();
  if ((bVar2 & 1) == 0) {
    uVar3 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    Exception::Exception(auVar7._8_8_,auVar7._0_8_,msg);
    __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
  }
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::clear
            ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)0xba1bb3);
  (**(code **)(*in_RDI + 0x28))();
  FactorGraph::nrEdges((FactorGraph *)0xba1bd5);
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::reserve
            ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
             in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
  local_58 = (TProb<double> *)0x0;
  while( true ) {
    pTVar6 = local_58;
    (**(code **)(*in_RDI + 0x28))();
    this_00 = (TProb<double> *)FactorGraph::nrEdges((FactorGraph *)0xba1c28);
    if (this_00 <= pTVar6) break;
    n = (**(code **)(*in_RDI + 0x28))();
    peVar4 = FactorGraph::edge(in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8);
    uVar1 = peVar4->first;
    plVar5 = (long *)(**(code **)(*in_RDI + 0x28))();
    this_01 = (Var *)(**(code **)(*plVar5 + 0x30))(plVar5,uVar1);
    in_stack_fffffffffffffeb0 = (FactorGraph *)Var::states(this_01);
    TProb<double>::TProb(this_00,n);
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::push_back
              ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
               in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    TProb<double>::~TProb((TProb<double> *)0xba1d0c);
    local_58 = (TProb<double> *)
               ((long)&(local_58->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator=
            (this_02,__x);
  init_rho_e((TRW *)CONCAT17(in_stack_ffffffffffffffb7,
                             CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)));
  return;
}

Assistant:

TRW::TRW(const FactorGraph & fg, const Properties &opts) : DAIAlgFG(fg, opts), Props(), _maxdiff(0.0), _iterations(0UL), _messages(), _newmessages(), _rho_e(), _rho_e_descent() {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        // clear messages
        _messages.clear();
        _messages.reserve(grm().nrEdges());

        // create messages
        for( size_t iI = 0; iI < grm().nrEdges(); iI++ ) {
            size_t i = grm().edge(iI).first;
            _messages.push_back( Prob( grm().var(i).states() ) );
        }

        // create new_messages
        _newmessages = _messages;

        // create valid initial rho_e
        init_rho_e();
    }